

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# print.c
# Opt level: O1

void printexpr(FILE *out,expr *expr,int lvl)

{
  uint uVar1;
  char **ppcVar2;
  int lvl_00;
  char *pcVar3;
  expr *expr_00;
  char *pcVar4;
  char *__format;
  long lVar5;
  
LAB_001708b9:
  switch(expr->type) {
  case EXPR_NUM:
    goto switchD_001708cd_caseD_0;
  case EXPR_ID:
    pcVar3 = expr->str;
    if (expr->special == 2) {
      ppcVar2 = &cunk;
    }
    else if (expr->special == 1) {
      ppcVar2 = &cnum;
    }
    else {
      ppcVar2 = &cname;
    }
    pcVar4 = *ppcVar2;
    __format = "%s%s";
    goto LAB_00171052;
  case EXPR_LABEL:
    pcVar3 = expr->str;
    if (expr->special == 2) {
      ppcVar2 = &cunk;
    }
    else {
      ppcVar2 = &cnum;
    }
    pcVar4 = *ppcVar2;
    __format = "%s#%s";
    goto LAB_00171052;
  case EXPR_REG:
    pcVar3 = expr->str;
    if (expr->special == 2) {
      ppcVar2 = &cunk;
    }
    else if (expr->special == 1) {
      ppcVar2 = &creg1;
    }
    else {
      ppcVar2 = &creg0;
    }
    pcVar4 = *ppcVar2;
    __format = "%s$%s";
LAB_00171052:
    fprintf((FILE *)out,__format,pcVar4,pcVar3);
    return;
  case EXPR_MEM:
    if (expr->str != (char *)0x0) {
      fprintf((FILE *)out,"%s%s[",cmem);
    }
    printexpr(out,expr->expr1,0);
    if (expr->str == (char *)0x0) {
      return;
    }
    pcVar4 = "%s]";
    pcVar3 = cmem;
    goto LAB_00170e31;
  case EXPR_VEC:
    fprintf((FILE *)out,"%s{",cnorm);
    if (0 < expr->vexprsnum) {
      lVar5 = 0;
      do {
        fputc(0x20,(FILE *)out);
        printexpr(out,expr->vexprs[lVar5],0);
        lVar5 = lVar5 + 1;
      } while (lVar5 < expr->vexprsnum);
    }
    pcVar4 = " %s}";
    pcVar3 = cnorm;
    goto LAB_00170e31;
  case EXPR_DISCARD:
    pcVar4 = "%s#";
    pcVar3 = creg0;
    goto LAB_00170e31;
  case EXPR_BITFIELD:
    fprintf((FILE *)out,"%s%lld:%lld",cnum,expr->num1,expr->num2);
    return;
  case EXPR_NEG:
    pcVar3 = "%s-";
    goto LAB_00170a1e;
  case EXPR_NOT:
    pcVar3 = "%s~";
LAB_00170a1e:
    fprintf((FILE *)out,pcVar3,cmem);
    expr = expr->expr1;
    lvl = 7;
    goto LAB_001708b9;
  case EXPR_MUL:
    if (6 < lvl) {
      fprintf((FILE *)out,"%s(",cmem);
      printexpr(out,expr->expr1,6);
      pcVar3 = "%s*";
LAB_00170dc5:
      fprintf((FILE *)out,pcVar3,cmem);
      expr_00 = expr->expr2;
      lvl_00 = 7;
      break;
    }
    printexpr(out,expr->expr1,6);
    pcVar3 = "%s*";
    goto LAB_00170a98;
  case EXPR_DIV:
    if (6 < lvl) {
      fprintf((FILE *)out,"%s(",cmem);
      printexpr(out,expr->expr1,6);
      pcVar3 = "%s/";
      goto LAB_00170dc5;
    }
    printexpr(out,expr->expr1,6);
    pcVar3 = "%s/";
LAB_00170a98:
    fprintf((FILE *)out,pcVar3,cmem);
    expr = expr->expr2;
    lvl = 7;
    goto LAB_001708b9;
  case EXPR_ADD:
    if (5 < lvl) {
      fprintf((FILE *)out,"%s(",cmem);
      printexpr(out,expr->expr1,5);
      pcVar3 = "%s+";
      goto LAB_00170d46;
    }
    printexpr(out,expr->expr1,5);
    pcVar3 = "%s+";
LAB_00170afb:
    fprintf((FILE *)out,pcVar3,cmem);
    expr = expr->expr2;
    lvl = 6;
    goto LAB_001708b9;
  case EXPR_SUB:
    if (lvl < 6) {
      printexpr(out,expr->expr1,5);
      pcVar3 = "%s-";
      goto LAB_00170afb;
    }
    fprintf((FILE *)out,"%s(",cmem);
    printexpr(out,expr->expr1,5);
    pcVar3 = "%s-";
LAB_00170d46:
    fprintf((FILE *)out,pcVar3,cmem);
    expr_00 = expr->expr2;
    lvl_00 = 6;
    break;
  case EXPR_SHL:
    if (4 < lvl) {
      fprintf((FILE *)out,"%s(",cmem);
      printexpr(out,expr->expr1,4);
      pcVar3 = "%s<<";
      goto LAB_00170c62;
    }
    printexpr(out,expr->expr1,4);
    pcVar3 = "%s<<";
LAB_00170a5b:
    fprintf((FILE *)out,pcVar3,cmem);
    expr = expr->expr2;
    lvl = 5;
    goto LAB_001708b9;
  case EXPR_SHR:
    if (lvl < 5) {
      printexpr(out,expr->expr1,4);
      pcVar3 = "%s>>";
      goto LAB_00170a5b;
    }
    fprintf((FILE *)out,"%s(",cmem);
    printexpr(out,expr->expr1,4);
    pcVar3 = "%s>>";
LAB_00170c62:
    fprintf((FILE *)out,pcVar3,cmem);
    expr_00 = expr->expr2;
    lvl_00 = 5;
    break;
  case EXPR_AND:
    if (lvl < 4) {
      printexpr(out,expr->expr1,3);
      fprintf((FILE *)out,"%s&",cmem);
      expr = expr->expr2;
      lvl = 4;
      goto LAB_001708b9;
    }
    fprintf((FILE *)out,"%s(",cmem);
    printexpr(out,expr->expr1,3);
    fprintf((FILE *)out,"%s&",cmem);
    expr_00 = expr->expr2;
    lvl_00 = 4;
    break;
  case EXPR_XOR:
    if (lvl < 3) {
      printexpr(out,expr->expr1,2);
      fprintf((FILE *)out,"%s^",cmem);
      expr = expr->expr2;
      lvl = 3;
      goto LAB_001708b9;
    }
    fprintf((FILE *)out,"%s(",cmem);
    printexpr(out,expr->expr1,2);
    fprintf((FILE *)out,"%s^",cmem);
    expr_00 = expr->expr2;
    lvl_00 = 3;
    break;
  case EXPR_OR:
    if (lvl < 2) {
      printexpr(out,expr->expr1,1);
      fprintf((FILE *)out,"%s|",cmem);
      expr = expr->expr2;
      lvl = 2;
      goto LAB_001708b9;
    }
    fprintf((FILE *)out,"%s(",cmem);
    printexpr(out,expr->expr1,1);
    fprintf((FILE *)out,"%s|",cmem);
    expr_00 = expr->expr2;
    lvl_00 = 2;
    break;
  case EXPR_PIADD:
    if (0 < lvl) {
      fprintf((FILE *)out,"%s(",cmem);
      printexpr(out,expr->expr1,0);
      pcVar3 = "%s++";
      goto LAB_00170e0b;
    }
    printexpr(out,expr->expr1,0);
    pcVar3 = "%s++";
LAB_00170991:
    fprintf((FILE *)out,pcVar3,cmem);
    expr = expr->expr2;
    lvl = 1;
    goto LAB_001708b9;
  case EXPR_PISUB:
    if (lvl < 1) {
      printexpr(out,expr->expr1,0);
      pcVar3 = "%s--";
      goto LAB_00170991;
    }
    fprintf((FILE *)out,"%s(",cmem);
    printexpr(out,expr->expr1,0);
    pcVar3 = "%s--";
LAB_00170e0b:
    fprintf((FILE *)out,pcVar3,cmem);
    expr_00 = expr->expr2;
    lvl_00 = 1;
    break;
  case EXPR_SESTART:
    pcVar4 = "%s(";
    pcVar3 = cmem;
    goto LAB_00170e31;
  case EXPR_SEEND:
    goto switchD_001708cd_caseD_16;
  default:
    __assert_fail("0",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/polachok[P]envytools/envydis/print.c"
                  ,0xdd,"void printexpr(FILE *, const struct expr *, int)");
  }
  printexpr(out,expr_00,lvl_00);
switchD_001708cd_caseD_16:
  pcVar4 = "%s)";
  pcVar3 = cmem;
  goto LAB_00170e31;
switchD_001708cd_caseD_0:
  uVar1 = expr->special - 1;
  if (uVar1 < 3) {
    ppcVar2 = (char **)(&PTR_cbtarg_00177db8)[uVar1];
  }
  else {
    ppcVar2 = &cnum;
  }
  fputs(*ppcVar2,(FILE *)out);
  pcVar3 = (char *)expr->num1;
  if ((long)pcVar3 < 0) {
    pcVar3 = (char *)-(long)pcVar3;
    pcVar4 = "-%#llx";
  }
  else {
    pcVar4 = "%#llx";
  }
LAB_00170e31:
  fprintf((FILE *)out,pcVar4,pcVar3);
  return;
}

Assistant:

void printexpr(FILE *out, const struct expr *expr, int lvl) {
	int i;
	switch (expr->type) {
		case EXPR_NUM:
			switch (expr->special) {
				case 1:
					fprintf(out, "%s", cbtarg);
					break;
				case 2:
					fprintf(out, "%s", cctarg);
					break;
				case 3:
					fprintf(out, "%s", cmem);
					break;
				default:
					fprintf(out, "%s", cnum);
					break;
			}
			if (expr->num1 & 1ull << 63)
				fprintf(out, "-%#llx", -expr->num1);
			else
				fprintf(out, "%#llx", expr->num1);
			return;
		case EXPR_ID:
			switch (expr->special) {
				case 1:
					fprintf(out, "%s%s", cnum, expr->str);
					break;
				case 2:
					fprintf(out, "%s%s", cunk, expr->str);
					break;
				default:
					fprintf(out, "%s%s", cname, expr->str);
					break;
			}
			return;
		case EXPR_LABEL:
			switch (expr->special) {
				case 2:
					fprintf(out, "%s#%s", cunk, expr->str);
					break;
				default:
					fprintf(out, "%s#%s", cnum, expr->str);
					break;
			}
			return;
		case EXPR_REG:
			switch (expr->special) {
				case 1:
					fprintf(out, "%s$%s", creg1, expr->str);
					break;
				case 2:
					fprintf(out, "%s$%s", cunk, expr->str);
					break;
				default:
					fprintf(out, "%s$%s", creg0, expr->str);
					break;
			}
			return;
		case EXPR_MEM:
			if (expr->str)
				fprintf(out, "%s%s[", cmem, expr->str);
			printexpr(out, expr->expr1, 0);
			if (expr->str)
				fprintf(out, "%s]", cmem);
			return;
		case EXPR_VEC:
			fprintf(out, "%s{", cnorm);
			for (i = 0; i < expr->vexprsnum; i++) {
				fprintf(out, " ");
				printexpr(out, expr->vexprs[i], 0);
			}
			fprintf(out, " %s}", cnorm);
			return;
		case EXPR_DISCARD:
			fprintf(out, "%s#", creg0);
			return;
		case EXPR_BITFIELD:
			fprintf(out, "%s%lld:%lld", cnum, expr->num1, expr->num2);
			return;
		case EXPR_NEG:
			fprintf(out, "%s-", cmem);
			printexpr(out, expr->expr1, 7);
			return;
		case EXPR_NOT:
			fprintf(out, "%s~", cmem);
			printexpr(out, expr->expr1, 7);
			return;
		case EXPR_MUL:
			if (lvl >= 7)
				fprintf(out, "%s(", cmem);
			printexpr(out, expr->expr1, 6);
			fprintf(out, "%s*", cmem);
			printexpr(out, expr->expr2, 7);
			if (lvl >= 7)
				fprintf(out, "%s)", cmem);
			return;
		case EXPR_DIV:
			if (lvl >= 7)
				fprintf(out, "%s(", cmem);
			printexpr(out, expr->expr1, 6);
			fprintf(out, "%s/", cmem);
			printexpr(out, expr->expr2, 7);
			if (lvl >= 7)
				fprintf(out, "%s)", cmem);
			return;
		case EXPR_ADD:
			if (lvl >= 6)
				fprintf(out, "%s(", cmem);
			printexpr(out, expr->expr1, 5);
			fprintf(out, "%s+", cmem);
			printexpr(out, expr->expr2, 6);
			if (lvl >= 6)
				fprintf(out, "%s)", cmem);
			return;
		case EXPR_SUB:
			if (lvl >= 6)
				fprintf(out, "%s(", cmem);
			printexpr(out, expr->expr1, 5);
			fprintf(out, "%s-", cmem);
			printexpr(out, expr->expr2, 6);
			if (lvl >= 6)
				fprintf(out, "%s)", cmem);
			return;
		case EXPR_SHL:
			if (lvl >= 5)
				fprintf(out, "%s(", cmem);
			printexpr(out, expr->expr1, 4);
			fprintf(out, "%s<<", cmem);
			printexpr(out, expr->expr2, 5);
			if (lvl >= 5)
				fprintf(out, "%s)", cmem);
			return;
		case EXPR_SHR:
			if (lvl >= 5)
				fprintf(out, "%s(", cmem);
			printexpr(out, expr->expr1, 4);
			fprintf(out, "%s>>", cmem);
			printexpr(out, expr->expr2, 5);
			if (lvl >= 5)
				fprintf(out, "%s)", cmem);
			return;
		case EXPR_AND:
			if (lvl >= 4)
				fprintf(out, "%s(", cmem);
			printexpr(out, expr->expr1, 3);
			fprintf(out, "%s&", cmem);
			printexpr(out, expr->expr2, 4);
			if (lvl >= 4)
				fprintf(out, "%s)", cmem);
			return;
		case EXPR_XOR:
			if (lvl >= 3)
				fprintf(out, "%s(", cmem);
			printexpr(out, expr->expr1, 2);
			fprintf(out, "%s^", cmem);
			printexpr(out, expr->expr2, 3);
			if (lvl >= 3)
				fprintf(out, "%s)", cmem);
			return;
		case EXPR_OR:
			if (lvl >= 2)
				fprintf(out, "%s(", cmem);
			printexpr(out, expr->expr1, 1);
			fprintf(out, "%s|", cmem);
			printexpr(out, expr->expr2, 2);
			if (lvl >= 2)
				fprintf(out, "%s)", cmem);
			return;
		case EXPR_PIADD:
			if (lvl >= 1)
				fprintf(out, "%s(", cmem);
			printexpr(out, expr->expr1, 0);
			fprintf(out, "%s++", cmem);
			printexpr(out, expr->expr2, 1);
			if (lvl >= 1)
				fprintf(out, "%s)", cmem);
			return;
		case EXPR_PISUB:
			if (lvl >= 1)
				fprintf(out, "%s(", cmem);
			printexpr(out, expr->expr1, 0);
			fprintf(out, "%s--", cmem);
			printexpr(out, expr->expr2, 1);
			if (lvl >= 1)
				fprintf(out, "%s)", cmem);
			return;
		case EXPR_SESTART:
			fprintf(out, "%s(", cmem);
			return;
		case EXPR_SEEND:
			fprintf(out, "%s)", cmem);
			return;
		default:
			assert(0);
	}
}